

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::
     json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::replace_substring(string *s,string *f,string *t)

{
  byte bVar1;
  string *psVar2;
  ulong local_28;
  size_type pos;
  string *t_local;
  string *f_local;
  string *s_local;
  
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("not f.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x290e,
                  "static void nlohmann::json_pointer<nlohmann::basic_json<>>::replace_substring(std::string &, const std::string &, const std::string &) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  local_28 = std::__cxx11::string::find((string *)s,(ulong)f);
  while (local_28 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)s,local_28,psVar2);
    std::__cxx11::string::size();
    local_28 = std::__cxx11::string::find((string *)s,(ulong)f);
  }
  return;
}

Assistant:

static void replace_substring(std::string& s, const std::string& f, const std::string& t) {
		assert(not f.empty());
		for (auto pos = s.find(f);  // find first occurrence of f
			 pos != std::string::npos;  // make sure f was found
			 s.replace(pos, f.size(), t),  // replace with t, and
			 pos = s.find(f, pos + t.size()))  // find next occurrence of f
		{
		}
	}